

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O3

void __thiscall
Diligent::VariableSizeAllocationsManager::VariableSizeAllocationsManager
          (VariableSizeAllocationsManager *this,CreateInfo *CI)

{
  _Rb_tree_header *p_Var1;
  OffsetType Size;
  ulong uVar2;
  ulong uVar3;
  
  (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.m_Allocator = CI->Allocator;
  (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.m_dvpDescription =
       "Allocator for map<OffsetType, FreeBlockInfo>";
  (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
  ;
  (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.m_dvpLineNumber = 0x6d;
  p_Var1 = &(this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header;
  (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.m_Allocator = CI->Allocator;
  (this->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.m_dvpDescription =
       "Allocator for multimap<OffsetType, TFreeBlocksByOffsetMap::iterator>";
  (this->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
  ;
  (this->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.m_dvpLineNumber = 0x6e;
  p_Var1 = &(this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header;
  (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Size = CI->MaxSize;
  this->m_MaxSize = Size;
  this->m_FreeSize = Size;
  this->m_CurrAlignment = 0;
  this->m_DbgDisableDebugValidation = CI->DbgDisableDebugValidation;
  AddNewBlock(this,0,Size);
  uVar2 = 1;
  do {
    uVar3 = uVar2;
    uVar2 = uVar3 * 2;
  } while (uVar2 <= this->m_MaxSize);
  this->m_CurrAlignment = uVar3;
  DbgVerifyList(this);
  return;
}

Assistant:

explicit VariableSizeAllocationsManager(const CreateInfo& CI)
        // clang-format off
        : m_FreeBlocksByOffset{STD_ALLOCATOR_RAW_MEM(TFreeBlocksByOffsetMap::value_type, CI.Allocator, "Allocator for map<OffsetType, FreeBlockInfo>")}
        , m_FreeBlocksBySize  {STD_ALLOCATOR_RAW_MEM(TFreeBlocksBySizeMap::value_type,   CI.Allocator, "Allocator for multimap<OffsetType, TFreeBlocksByOffsetMap::iterator>")}
        , m_MaxSize {CI.MaxSize}
        , m_FreeSize{CI.MaxSize}
#ifdef DILIGENT_DEBUG
        , m_DbgDisableDebugValidation{CI.DbgDisableDebugValidation}
#endif
    // clang-format on
    {
        // Insert single maximum-size block
        AddNewBlock(0, m_MaxSize);
        ResetCurrAlignment();

#ifdef DILIGENT_DEBUG
        DbgVerifyList();
#endif
    }